

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O0

void __thiscall
Storage::Disk::PCMTrack::add_segment
          (PCMTrack *this,Time *start_time,PCMSegment *segment,bool clamp_to_index_hole)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  const_reference cVar4;
  reference this_00;
  size_type sVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  long lVar8;
  ulong uVar9;
  vector<bool,_std::allocator<bool>_> *this_01;
  iterator iVar10;
  iterator iVar11;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __last_01;
  _Bit_iterator __last_02;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __first_01;
  _Bit_iterator __first_02;
  reference local_250;
  ulong local_240;
  size_t output_bit_1;
  ptrdiff_t bit_1;
  _Bit_type *local_228;
  uint local_220;
  _Bit_type *local_218;
  uint local_210;
  _Bit_type *local_208;
  uint local_200;
  _Bit_type *local_1f8;
  uint local_1f0;
  iterator local_1e8;
  _Bit_type *local_1d8;
  uint local_1d0;
  bool local_1c1;
  _Bit_type *local_1c0;
  uint local_1b8;
  _Bit_type *local_1b0;
  uint local_1a8;
  iterator local_1a0;
  _Bit_type *local_190;
  uint local_188;
  _Bit_type *local_180;
  uint local_178;
  _Bit_type *local_170;
  uint local_168;
  bool local_159;
  _Bit_type *local_158;
  uint local_150;
  _Bit_type *local_148;
  uint local_140;
  _Bit_type *local_138;
  uint local_130;
  _Bit_type *local_128;
  uint local_120;
  reference local_118;
  size_type local_108;
  size_t output_bit;
  size_t bit;
  _Bit_type *local_f0;
  uint local_e8;
  _Bit_type *local_e0;
  uint local_d8;
  iterator local_d0;
  _Bit_type *local_c0;
  uint local_b8;
  _Bit_type *local_b0;
  uint local_a8;
  _Bit_type *local_a0;
  uint local_98;
  iterator local_90;
  _Bit_type *local_80;
  uint local_78;
  size_type local_70;
  unsigned_long local_68;
  size_t selected_end_bit;
  size_t half_offset;
  size_t target_width;
  size_t end_bit;
  size_t start_bit;
  Time local_38;
  Time end_time;
  PCMSegment *destination;
  bool clamp_to_index_hole_local;
  PCMSegment *segment_local;
  Time *start_time_local;
  PCMTrack *this_local;
  
  this_00 = std::
            vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
            ::front(&this->segment_event_sources_);
  end_time = (Time)PCMSegmentEventSource::segment(this_00);
  start_bit = (size_t)PCMSegment::length(segment);
  local_38 = Time::operator+(start_time,(Time *)&start_bit);
  uVar1 = start_time->length;
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
  end_bit = (uVar1 * sVar5) / (ulong)start_time->clock_rate;
  uVar6 = (ulong)local_38 & 0xffffffff;
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
  target_width = (uVar6 * sVar5) / ((ulong)local_38 >> 0x20);
  uVar6 = target_width - end_bit;
  half_offset = uVar6;
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&segment->data);
  sVar2 = target_width;
  selected_end_bit = uVar6 / (sVar5 << 1);
  if ((clamp_to_index_hole) ||
     (sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8)),
     sVar3 = half_offset, sVar2 <= sVar5)) {
    local_70 = std::vector<bool,_std::allocator<bool>_>::size
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
    puVar7 = std::min<unsigned_long>(&target_width,&local_70);
    local_68 = *puVar7;
    iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
    local_a0 = iVar10.super__Bit_iterator_base._M_p;
    local_98 = iVar10.super__Bit_iterator_base._M_offset;
    local_90.super__Bit_iterator_base._M_p = local_a0;
    local_90.super__Bit_iterator_base._M_offset = local_98;
    iVar11 = std::operator+(&local_90,end_bit);
    local_b0 = iVar11.super__Bit_iterator_base._M_p;
    local_a8 = iVar11.super__Bit_iterator_base._M_offset;
    local_80 = local_b0;
    local_78 = local_a8;
    iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
    local_e0 = iVar10.super__Bit_iterator_base._M_p;
    local_d8 = iVar10.super__Bit_iterator_base._M_offset;
    local_d0.super__Bit_iterator_base._M_p = local_e0;
    local_d0.super__Bit_iterator_base._M_offset = local_d8;
    iVar11 = std::operator+(&local_d0,local_68);
    local_f0 = iVar11.super__Bit_iterator_base._M_p;
    local_e8 = iVar11.super__Bit_iterator_base._M_offset;
    bit._7_1_ = 0;
    __first.super__Bit_iterator_base._M_offset = local_78;
    __first.super__Bit_iterator_base._M_p = local_80;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
    __first.super__Bit_iterator_base._12_4_ = 0;
    local_c0 = local_f0;
    local_b8 = local_e8;
    std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&bit + 7));
    for (output_bit = 0; sVar2 = output_bit,
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&segment->data), sVar2 < sVar5;
        output_bit = output_bit + 1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&segment->data,output_bit);
      if (cVar4) {
        lVar8 = end_bit + selected_end_bit;
        uVar6 = output_bit * half_offset;
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&segment->data);
        uVar6 = lVar8 + uVar6 / sVar5;
        local_108 = uVar6;
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
        if (sVar5 <= uVar6) {
          return;
        }
        local_118 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8),local_108
                              );
        std::_Bit_reference::operator=(&local_118,true);
      }
    }
  }
  else {
    sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
    if (sVar3 < sVar5) {
      iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      local_180 = iVar10.super__Bit_iterator_base._M_p;
      local_178 = iVar10.super__Bit_iterator_base._M_offset;
      local_170 = local_180;
      local_168 = local_178;
      iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      sVar2 = target_width;
      local_1b0 = iVar10.super__Bit_iterator_base._M_p;
      local_1a8 = iVar10.super__Bit_iterator_base._M_offset;
      local_1a0.super__Bit_iterator_base._M_p = local_1b0;
      local_1a0.super__Bit_iterator_base._M_offset = local_1a8;
      sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      iVar11 = std::operator+(&local_1a0,sVar2 % sVar5);
      local_1c0 = iVar11.super__Bit_iterator_base._M_p;
      local_1b8 = iVar11.super__Bit_iterator_base._M_offset;
      local_1c1 = false;
      __first_01.super__Bit_iterator_base._M_offset = local_168;
      __first_01.super__Bit_iterator_base._M_p = local_170;
      __last_01.super__Bit_iterator_base._12_4_ = 0;
      __last_01.super__Bit_iterator_base._M_p =
           (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
      __last_01.super__Bit_iterator_base._M_offset =
           SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
      __first_01.super__Bit_iterator_base._12_4_ = 0;
      local_190 = local_1c0;
      local_188 = local_1b8;
      std::fill<std::_Bit_iterator,bool>(__first_01,__last_01,&local_1c1);
      iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      local_1f8 = iVar10.super__Bit_iterator_base._M_p;
      local_1f0 = iVar10.super__Bit_iterator_base._M_offset;
      local_1e8.super__Bit_iterator_base._M_p = local_1f8;
      local_1e8.super__Bit_iterator_base._M_offset = local_1f0;
      iVar11 = std::operator+(&local_1e8,end_bit);
      local_208 = iVar11.super__Bit_iterator_base._M_p;
      local_200 = iVar11.super__Bit_iterator_base._M_offset;
      local_1d8 = local_208;
      local_1d0 = local_200;
      iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      local_228 = iVar10.super__Bit_iterator_base._M_p;
      local_220 = iVar10.super__Bit_iterator_base._M_offset;
      bit_1._7_1_ = 0;
      __first_02.super__Bit_iterator_base._M_offset = local_1d0;
      __first_02.super__Bit_iterator_base._M_p = local_1d8;
      __last_02.super__Bit_iterator_base._12_4_ = 0;
      __last_02.super__Bit_iterator_base._M_p =
           (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
      __last_02.super__Bit_iterator_base._M_offset =
           SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
      __first_02.super__Bit_iterator_base._12_4_ = 0;
      local_218 = local_228;
      local_210 = local_220;
      std::fill<std::_Bit_iterator,bool>(__first_02,__last_02,(bool *)((long)&bit_1 + 7));
    }
    else {
      iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      local_138 = iVar10.super__Bit_iterator_base._M_p;
      local_130 = iVar10.super__Bit_iterator_base._M_offset;
      local_128 = local_138;
      local_120 = local_130;
      iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
      local_158 = iVar10.super__Bit_iterator_base._M_p;
      local_150 = iVar10.super__Bit_iterator_base._M_offset;
      local_159 = false;
      __first_00.super__Bit_iterator_base._M_offset = local_120;
      __first_00.super__Bit_iterator_base._M_p = local_128;
      __last_00.super__Bit_iterator_base._12_4_ = 0;
      __last_00.super__Bit_iterator_base._M_p =
           (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
      __last_00.super__Bit_iterator_base._M_offset =
           SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
      __first_00.super__Bit_iterator_base._12_4_ = 0;
      local_148 = local_158;
      local_140 = local_150;
      std::fill<std::_Bit_iterator,bool>(__first_00,__last_00,&local_159);
    }
    output_bit_1 = std::vector<bool,_std::allocator<bool>_>::size(&segment->data);
    while (output_bit_1 = output_bit_1 - 1, -1 < (long)output_bit_1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&segment->data,output_bit_1);
      if (cVar4) {
        lVar8 = end_bit + selected_end_bit;
        uVar6 = output_bit_1 * half_offset;
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&segment->data);
        sVar2 = target_width;
        uVar9 = lVar8 + uVar6 / sVar5;
        local_240 = uVar9;
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
        uVar6 = local_240;
        if (uVar9 < sVar2 - sVar5) {
          return;
        }
        this_01 = (vector<bool,_std::allocator<bool>_> *)((long)end_time + 8);
        sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)((long)end_time + 8));
        local_250 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar6 % sVar5);
        std::_Bit_reference::operator=(&local_250,true);
      }
    }
  }
  return;
}

Assistant:

void PCMTrack::add_segment(const Time &start_time, const PCMSegment &segment, bool clamp_to_index_hole) {
	// Get a reference to the destination.
	PCMSegment &destination = segment_event_sources_.front().segment();

	// Determine the range to fill on the target segment.
	const Time end_time = start_time + segment.length();
	const size_t start_bit = start_time.length * destination.data.size() / start_time.clock_rate;
	const size_t end_bit = end_time.length * destination.data.size() / end_time.clock_rate;
	const size_t target_width = end_bit - start_bit;
	const size_t half_offset = target_width / (2 * segment.data.size());

	if(clamp_to_index_hole || end_bit <= destination.data.size()) {
		// If clamping is applied, just write a single segment, from the start_bit to whichever is
		// closer of the end of track and the end_bit.
		const size_t selected_end_bit = std::min(end_bit, destination.data.size());

		// Reset the destination.
		std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.begin() + ptrdiff_t(selected_end_bit), false);

		// Step through the source data from start to finish, stopping early if it goes out of bounds.
		for(size_t bit = 0; bit < segment.data.size(); ++bit) {
			if(segment.data[bit]) {
				const size_t output_bit = start_bit + half_offset + (bit * target_width) / segment.data.size();
				if(output_bit >= destination.data.size()) return;
				destination.data[output_bit] = true;
			}
		}
	} else {
		// Clamping is not enabled, so the supplied segment loops over the index hole, arbitrarily many times.
		// So work backwards unless or until the original start position is reached, then stop.

		// This definitely runs over the index hole; check whether the whole track needs clearing, or whether
		// a centre segment is untouched.
		if(target_width >= destination.data.size()) {
			std::fill(destination.data.begin(), destination.data.end(), false);
		} else {
			std::fill(destination.data.begin(), destination.data.begin() + ptrdiff_t(end_bit % destination.data.size()), false);
			std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.end(), false);
		}

		// Run backwards from final bit back to first, stopping early if overlapping the beginning.
		for(auto bit = ptrdiff_t(segment.data.size()-1); bit >= 0; --bit) {
			// Store flux transitions only; non-transitions can be ignored.
			if(segment.data[size_t(bit)]) {
				// Map to the proper output destination; stop if now potentially overwriting where we began.
				const size_t output_bit = start_bit + half_offset + (size_t(bit) * target_width) / segment.data.size();
				if(output_bit < end_bit - destination.data.size()) return;

				// Store.
				destination.data[output_bit % destination.data.size()] = true;
			}
		}
	}
}